

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_get_info_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  char cVar1;
  short sVar2;
  uint uVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  bcf_info_t *pbVar6;
  long lVar7;
  uint32_t uVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  size_t __size;
  long lVar15;
  ulong uStack_40;
  
  uVar9 = bcf_hdr_id2int(hdr,0,tag);
  uStack_40 = 0xffffffffffffffff;
  if ((-1 < (int)uVar9) && (uVar3 = (hdr->id[0][uVar9].val)->info[1], (~uVar3 & 0xf) != 0)) {
    if ((uVar3 >> 4 & 0xf) == type) {
      if ((line->unpacked & 4) == 0) {
        bcf_unpack(line,4);
      }
      for (lVar15 = 0; (ulong)*(ushort *)&line->field_0x10 << 5 != lVar15; lVar15 = lVar15 + 0x20) {
        if (*(uint *)((long)&((line->d).info)->key + lVar15) == uVar9) {
          if ((uint)*(ushort *)&line->field_0x10 << 5 != (int)lVar15) {
            uStack_40 = 1;
            uVar11 = 1;
            if (type == 0) goto switchD_0011c7d3_caseD_4;
            pbVar6 = (line->d).info;
            uVar9 = *(uint *)((long)&pbVar6->len + lVar15);
            if (type == 3) {
              pvVar10 = *dst;
              if (*ndst <= (int)uVar9) {
                __size = (long)(int)uVar9 + 1;
                *ndst = (int)__size;
                pvVar10 = realloc(pvVar10,__size);
                *dst = pvVar10;
                uVar9 = *(uint *)((long)&pbVar6->len + lVar15);
              }
              memcpy(pvVar10,*(void **)((long)&pbVar6->vptr + lVar15),(long)(int)uVar9);
              *(undefined1 *)((long)*dst + (long)*(int *)((long)&pbVar6->len + lVar15)) = 0;
              uStack_40 = (ulong)*(uint *)((long)&pbVar6->len + lVar15);
              goto switchD_0011c7d3_caseD_4;
            }
            if (*ndst < (int)uVar9) {
              *ndst = uVar9;
              pvVar10 = realloc(*dst,(long)(int)uVar9 << 2);
              *dst = pvVar10;
              uVar9 = *(uint *)((long)&pbVar6->len + lVar15);
            }
            uVar8 = bcf_float_vector_end;
            uVar4 = *(undefined4 *)((long)&pbVar6->type + lVar15);
            if (uVar9 == 1) {
              uStack_40 = uVar11;
              switch(uVar4) {
              case 1:
                iVar14 = *(int *)((long)&pbVar6->v1 + lVar15);
                piVar12 = (int *)*dst;
                if (iVar14 == -0x80) {
LAB_0011c8fd:
                  *piVar12 = -0x80000000;
                  goto switchD_0011c7d3_caseD_4;
                }
                break;
              case 2:
                iVar14 = *(int *)((long)&pbVar6->v1 + lVar15);
                piVar12 = (int *)*dst;
                if (iVar14 == -0x8000) goto LAB_0011c8fd;
                break;
              case 3:
                iVar14 = *(int *)((long)&pbVar6->v1 + lVar15);
                piVar12 = (int *)*dst;
                break;
              default:
                goto switchD_0011c7d3_caseD_4;
              case 5:
                *(undefined4 *)*dst = *(undefined4 *)((long)&pbVar6->v1 + lVar15);
                goto switchD_0011c7d3_caseD_4;
              }
              *piVar12 = iVar14;
            }
            else {
              switch(uVar4) {
              case 1:
                pvVar10 = *dst;
                lVar7 = *(long *)((long)&pbVar6->vptr + lVar15);
                uStack_40 = 0;
                goto LAB_0011c814;
              case 2:
                pvVar10 = *dst;
                lVar7 = *(long *)((long)&pbVar6->vptr + lVar15);
                uStack_40 = 0;
                goto LAB_0011c8b5;
              case 3:
                pvVar10 = *dst;
                lVar7 = *(long *)((long)&pbVar6->vptr + lVar15);
                for (uStack_40 = 0;
                    ((long)uStack_40 < (long)(int)uVar9 &&
                    (iVar14 = *(int *)(lVar7 + uStack_40 * 4), iVar14 != -0x7fffffff));
                    uStack_40 = uStack_40 + 1) {
                  *(int *)((long)pvVar10 + uStack_40 * 4) = iVar14;
                  uVar9 = *(uint *)((long)&pbVar6->len + lVar15);
                }
                break;
              default:
                fprintf(_stderr,"TODO: %s:%d .. info->type=%d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                        ,0xc1d);
                exit(1);
              case 5:
                pvVar10 = *dst;
                lVar15 = *(long *)((long)&pbVar6->vptr + lVar15);
                uVar13 = 0;
                uVar11 = (ulong)uVar9;
                if ((int)uVar9 < 1) {
                  uVar11 = uVar13;
                }
                for (; (uStack_40 = uVar11, uVar11 != uVar13 &&
                       (uVar5 = *(uint32_t *)(lVar15 + uVar13 * 4), uStack_40 = uVar13,
                       uVar8 != uVar5)); uVar13 = uVar13 + 1) {
                  *(uint32_t *)((long)pvVar10 + uVar13 * 4) = uVar5;
                }
              }
            }
            goto switchD_0011c7d3_caseD_4;
          }
          break;
        }
      }
      uStack_40 = (ulong)((uint)(type == 0) * 3 - 3);
    }
    else {
      uStack_40 = 0xfffffffffffffffe;
    }
  }
switchD_0011c7d3_caseD_4:
  return (int)uStack_40;
LAB_0011c8b5:
  if ((long)(int)uVar9 <= (long)uStack_40) goto switchD_0011c7d3_caseD_4;
  sVar2 = *(short *)(lVar7 + uStack_40 * 2);
  iVar14 = -0x80000000;
  if (sVar2 != -0x8000) {
    if (sVar2 == -0x7fff) goto switchD_0011c7d3_caseD_4;
    iVar14 = (int)sVar2;
  }
  *(int *)((long)pvVar10 + uStack_40 * 4) = iVar14;
  uStack_40 = uStack_40 + 1;
  uVar9 = *(uint *)((long)&pbVar6->len + lVar15);
  goto LAB_0011c8b5;
LAB_0011c814:
  if ((long)(int)uVar9 <= (long)uStack_40) goto switchD_0011c7d3_caseD_4;
  cVar1 = *(char *)(lVar7 + uStack_40);
  iVar14 = -0x80000000;
  if (cVar1 != -0x80) {
    if (cVar1 == -0x7f) goto switchD_0011c7d3_caseD_4;
    iVar14 = (int)cVar1;
  }
  *(int *)((long)pvVar10 + uStack_40 * 4) = iVar14;
  uStack_40 = uStack_40 + 1;
  uVar9 = *(uint *)((long)&pbVar6->len + lVar15);
  goto LAB_0011c814;
}

Assistant:

int bcf_get_info_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,tag_id) ) return -1;    // no such INFO field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_INFO,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( line->d.info[i].key==tag_id ) break;
    if ( i==line->n_info ) return ( type==BCF_HT_FLAG ) ? 0 : -3;       // the tag is not present in this record
    if ( type==BCF_HT_FLAG ) return 1;

    bcf_info_t *info = &line->d.info[i];
    if ( type==BCF_HT_STR )
    {
        if ( *ndst < info->len+1 )
        {
            *ndst = info->len + 1;
            *dst  = realloc(*dst, *ndst);
        }
        memcpy(*dst,info->vptr,info->len);
        ((uint8_t*)*dst)[info->len] = 0;
        return info->len;
    }

    // Make sure the buffer is big enough
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < info->len )
    {
        *ndst = info->len;
        *dst  = realloc(*dst, *ndst * size1);
    }

    if ( info->len == 1 )
    {
        if ( info->type==BCF_BT_FLOAT ) *((float*)*dst) = info->v1.f;
        else 
        {
            #define BRANCH(type_t, missing) { \
                if ( info->v1.i==missing ) *((int32_t*)*dst) = bcf_int32_missing; \
                else *((int32_t*)*dst) = info->v1.i; \
            }
            switch (info->type)
            {
                case BCF_BT_INT8:  BRANCH(int8_t,  bcf_int8_missing ); break;
                case BCF_BT_INT16: BRANCH(int16_t, bcf_int16_missing); break;
                case BCF_BT_INT32: BRANCH(int32_t, bcf_int32_missing); break;
            }
            #undef BRANCH
        }
        return 1;
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t *) info->vptr; \
        for (j=0; j<info->len; j++) \
        { \
            if ( is_vector_end ) return j; \
            if ( is_missing ) set_missing; \
            else *tmp = p[j]; \
            tmp++; \
        } \
        return j; \
    }
    switch (info->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. info->type=%d\n", __FILE__,__LINE__, info->type); exit(1);
    }
    #undef BRANCH
    return -4;  // this can never happen
}